

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_step(xpath_parser *this,xpath_ast_node *set)

{
  xpath_lexer *this_00;
  byte bVar1;
  size_t sVar2;
  lexeme_t lVar3;
  nodetest_t nVar4;
  size_t length;
  xpath_ast_node *pxVar5;
  ulong uVar6;
  xpath_ast_node *pxVar7;
  xpath_ast_node *pxVar8;
  xpath_ast_node **ppxVar9;
  long lVar10;
  xpath_parse_result *pxVar11;
  char cVar12;
  char *pcVar13;
  char cVar14;
  xpath_parser *this_01;
  long lVar15;
  xpath_parser *name;
  size_t __n;
  xpath_ast_node *pxVar16;
  bool bVar17;
  
  if ((set != (xpath_ast_node *)0x0) && (set->_rettype != '\x01')) {
    pxVar11 = this->_result;
    pcVar13 = "Step has to be applied to node set";
    goto LAB_0012f697;
  }
  this_00 = &this->_lexer;
  lVar3 = (this->_lexer)._cur_lexeme;
  if (lVar3 == lex_double_dot) {
    xpath_lexer::next(this_00);
    if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
      pxVar5 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar5 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar5->_type = '8';
      pxVar5->_rettype = '\x01';
      pxVar5->_axis = '\t';
      pxVar5->_test = '\x02';
LAB_0012f2a8:
      pxVar5->_left = set;
      pxVar5->_right = (xpath_ast_node *)0x0;
      pxVar5->_next = (xpath_ast_node *)0x0;
      (pxVar5->_data).string = (char_t *)0x0;
      return pxVar5;
    }
  }
  else {
    if (lVar3 != lex_dot) {
      bVar17 = lVar3 != lex_axis_attribute;
      if (bVar17) {
        cVar12 = '\x03';
      }
      else {
        xpath_lexer::next(this_00);
        lVar3 = (this->_lexer)._cur_lexeme;
        cVar12 = '\x02';
      }
      if (lVar3 == lex_multiply) {
LAB_0012f172:
        xpath_lexer::next(this_00);
        pcVar13 = "";
        cVar14 = '\a';
        goto LAB_0012f186;
      }
      if (lVar3 != lex_string) {
LAB_0012f68c:
        pxVar11 = this->_result;
        pcVar13 = "Unrecognized node test";
        goto LAB_0012f697;
      }
      this_01 = (xpath_parser *)(this->_lexer)._cur_lexeme_contents.begin;
      name = (xpath_parser *)(this->_lexer)._cur_lexeme_contents.end;
      xpath_lexer::next(this_00);
      lVar3 = (this->_lexer)._cur_lexeme;
      if (lVar3 == lex_double_colon) {
        if (!bVar17) {
          pxVar11 = this->_result;
          pcVar13 = "Two axis specifiers in one step";
          goto LAB_0012f697;
        }
        bVar1 = *(byte *)&this_01->_alloc;
        if (bVar1 < 0x6e) {
          switch(bVar1) {
          case 0x61:
            lVar15 = (long)name - (long)this_01;
            if (lVar15 != 0) {
              lVar10 = 0;
              do {
                if ("ancestor"[lVar10] != this_01->_scratch[lVar10 + -0x48]) goto LAB_0012f322;
                lVar10 = lVar10 + 1;
              } while (lVar15 != lVar10);
            }
            if ("ancestor"[lVar15] == '\0') {
              cVar12 = '\0';
            }
            else {
LAB_0012f322:
              if (name != this_01) {
                lVar10 = 0;
                do {
                  if ("ancestor-or-self"[lVar10] != this_01->_scratch[lVar10 + -0x48])
                  goto LAB_0012f353;
                  lVar10 = lVar10 + 1;
                } while (lVar15 != lVar10);
              }
              if ("ancestor-or-self"[lVar15] == '\0') {
                cVar12 = '\x01';
              }
              else {
LAB_0012f353:
                if (name != this_01) {
                  lVar10 = 0;
                  do {
                    if ("Error parsing element attribute"[lVar10 + 0x16] !=
                        this_01->_scratch[lVar10 + -0x48]) goto switchD_0012f2ec_caseD_62;
                    lVar10 = lVar10 + 1;
                  } while (lVar15 != lVar10);
                }
                if ("Error parsing element attribute"[lVar15 + 0x16] != '\0')
                goto switchD_0012f2ec_caseD_62;
                cVar12 = '\x02';
              }
            }
            break;
          default:
switchD_0012f2ec_caseD_62:
            pxVar11 = this->_result;
            pcVar13 = "Unknown axis";
            goto LAB_0012f697;
          case 99:
            lVar15 = (long)name - (long)this_01;
            if (lVar15 != 0) {
              lVar10 = 0;
              do {
                if ("child"[lVar10] != this_01->_scratch[lVar10 + -0x48])
                goto switchD_0012f2ec_caseD_62;
                lVar10 = lVar10 + 1;
              } while (lVar15 != lVar10);
            }
            if ("child"[lVar15] != '\0') goto switchD_0012f2ec_caseD_62;
            cVar12 = '\x03';
            break;
          case 100:
            lVar15 = (long)name - (long)this_01;
            if (lVar15 != 0) {
              lVar10 = 0;
              do {
                if ("descendant"[lVar10] != this_01->_scratch[lVar10 + -0x48]) goto LAB_0012f43d;
                lVar10 = lVar10 + 1;
              } while (lVar15 != lVar10);
            }
            if ("descendant"[lVar15] == '\0') {
              cVar12 = '\x04';
            }
            else {
LAB_0012f43d:
              if (name != this_01) {
                lVar10 = 0;
                do {
                  if ("descendant-or-self"[lVar10] != this_01->_scratch[lVar10 + -0x48])
                  goto switchD_0012f2ec_caseD_62;
                  lVar10 = lVar10 + 1;
                } while (lVar15 != lVar10);
              }
              if ("descendant-or-self"[lVar15] != '\0') goto switchD_0012f2ec_caseD_62;
              cVar12 = '\x05';
            }
            break;
          case 0x66:
            lVar15 = (long)name - (long)this_01;
            if (lVar15 != 0) {
              lVar10 = 0;
              do {
                if ("following"[lVar10] != this_01->_scratch[lVar10 + -0x48]) goto LAB_0012f4ae;
                lVar10 = lVar10 + 1;
              } while (lVar15 != lVar10);
            }
            if ("following"[lVar15] == '\0') {
              cVar12 = '\x06';
            }
            else {
LAB_0012f4ae:
              if (name != this_01) {
                lVar10 = 0;
                do {
                  if ("following-sibling"[lVar10] != this_01->_scratch[lVar10 + -0x48])
                  goto switchD_0012f2ec_caseD_62;
                  lVar10 = lVar10 + 1;
                } while (lVar15 != lVar10);
              }
              if ("following-sibling"[lVar15] != '\0') goto switchD_0012f2ec_caseD_62;
              cVar12 = '\a';
            }
          }
        }
        else if (bVar1 == 0x6e) {
          lVar15 = (long)name - (long)this_01;
          if (lVar15 != 0) {
            lVar10 = 0;
            do {
              if ("namespace"[lVar10] != this_01->_scratch[lVar10 + -0x48])
              goto switchD_0012f2ec_caseD_62;
              lVar10 = lVar10 + 1;
            } while (lVar15 != lVar10);
          }
          if ("namespace"[lVar15] != '\0') goto switchD_0012f2ec_caseD_62;
          cVar12 = '\b';
        }
        else {
          if (bVar1 != 0x70) {
            if (bVar1 == 0x73) {
              lVar15 = (long)name - (long)this_01;
              if (lVar15 != 0) {
                lVar10 = 0;
                do {
                  if ("ancestor-or-self"[lVar10 + 0xc] != this_01->_scratch[lVar10 + -0x48])
                  goto switchD_0012f2ec_caseD_62;
                  lVar10 = lVar10 + 1;
                } while (lVar15 != lVar10);
              }
              if ("ancestor-or-self"[lVar15 + 0xc] == '\0') {
                cVar12 = '\f';
                goto LAB_0012f621;
              }
            }
            goto switchD_0012f2ec_caseD_62;
          }
          lVar15 = (long)name - (long)this_01;
          if (lVar15 != 0) {
            lVar10 = 0;
            do {
              if ("parent"[lVar10] != this_01->_scratch[lVar10 + -0x48]) goto LAB_0012f597;
              lVar10 = lVar10 + 1;
            } while (lVar15 != lVar10);
          }
          if ("parent"[lVar15] == '\0') {
            cVar12 = '\t';
          }
          else {
LAB_0012f597:
            if (name != this_01) {
              lVar10 = 0;
              do {
                if ("preceding"[lVar10] != this_01->_scratch[lVar10 + -0x48]) goto LAB_0012f5c4;
                lVar10 = lVar10 + 1;
              } while (lVar15 != lVar10);
            }
            if ("preceding"[lVar15] == '\0') {
              cVar12 = '\n';
            }
            else {
LAB_0012f5c4:
              if (name != this_01) {
                lVar10 = 0;
                do {
                  if ("preceding-sibling"[lVar10] != this_01->_scratch[lVar10 + -0x48])
                  goto switchD_0012f2ec_caseD_62;
                  lVar10 = lVar10 + 1;
                } while (lVar15 != lVar10);
              }
              if ("preceding-sibling"[lVar15] != '\0') goto switchD_0012f2ec_caseD_62;
              cVar12 = '\v';
            }
          }
        }
LAB_0012f621:
        xpath_lexer::next(this_00);
        lVar3 = (this->_lexer)._cur_lexeme;
        if (lVar3 == lex_multiply) goto LAB_0012f172;
        if (lVar3 != lex_string) goto LAB_0012f68c;
        this_01 = (xpath_parser *)(this->_lexer)._cur_lexeme_contents.begin;
        name = (xpath_parser *)(this->_lexer)._cur_lexeme_contents.end;
        xpath_lexer::next(this_00);
        lVar3 = (this->_lexer)._cur_lexeme;
      }
      if (lVar3 == lex_open_brace) {
        xpath_lexer::next(this_00);
        lVar3 = (this->_lexer)._cur_lexeme;
        if (lVar3 != lex_close_brace) {
          lVar15 = (long)name - (long)this_01;
          if (lVar15 != 0) {
            lVar10 = 0;
            do {
              if ("processing-instruction"[lVar10] != this_01->_scratch[lVar10 + -0x48])
              goto LAB_0012f75b;
              lVar10 = lVar10 + 1;
            } while (lVar15 != lVar10);
          }
          if ("processing-instruction"[lVar15] != '\0') {
LAB_0012f75b:
            pxVar11 = this->_result;
            pcVar13 = "Unmatched brace near node type test";
            goto LAB_0012f697;
          }
          if (lVar3 != lex_quoted_string) {
            pxVar11 = this->_result;
            pcVar13 = "Only literals are allowed as arguments to processing-instruction()";
            goto LAB_0012f697;
          }
          this_01 = (xpath_parser *)(this->_lexer)._cur_lexeme_contents.begin;
          name = (xpath_parser *)(this->_lexer)._cur_lexeme_contents.end;
          xpath_lexer::next(this_00);
          if ((this->_lexer)._cur_lexeme != lex_close_brace) {
            pxVar11 = this->_result;
            pcVar13 = "Unmatched brace near processing-instruction()";
            goto LAB_0012f697;
          }
          xpath_lexer::next(this_00);
          nVar4 = nodetest_pi;
          goto LAB_0012f6e8;
        }
        xpath_lexer::next(this_00);
        nVar4 = parse_node_test_type(this_01,(xpath_lexer_string *)name);
        if (nVar4 == nodetest_none) {
          pxVar11 = this->_result;
          pcVar13 = "Unrecognized node type";
          goto LAB_0012f697;
        }
      }
      else {
        nVar4 = nodetest_name;
        if ((2 < (long)name - (long)this_01) && (*(char *)((long)&name[-1]._depth + 6) == ':')) {
          bVar17 = *(char *)((long)&name[-1]._depth + 7) == '*';
          if (bVar17) {
            name = (xpath_parser *)((long)&name[-1]._depth + 7);
          }
          nVar4 = nodetest_name;
          if (bVar17) {
            nVar4 = nodetest_all_in_namespace;
          }
        }
LAB_0012f6e8:
        cVar14 = (char)nVar4;
        if (this_01 != (xpath_parser *)0x0) {
          __n = (long)name - (long)this_01;
          pcVar13 = (char *)xpath_allocator::allocate(this->_alloc,__n + 1);
          if (pcVar13 == (char *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          memcpy(pcVar13,this_01,__n);
          pcVar13[__n] = '\0';
          goto LAB_0012f186;
        }
      }
      cVar14 = (char)nVar4;
      pcVar13 = "";
LAB_0012f186:
      pxVar5 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar5 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar5->_type = '8';
      pxVar5->_rettype = '\x01';
      pxVar5->_axis = cVar12;
      pxVar5->_test = cVar14;
      pxVar5->_left = set;
      pxVar5->_right = (xpath_ast_node *)0x0;
      pxVar5->_next = (xpath_ast_node *)0x0;
      (pxVar5->_data).string = pcVar13;
      sVar2 = this->_depth;
      if ((this->_lexer)._cur_lexeme == lex_open_square_brace) {
        pxVar16 = (xpath_ast_node *)0x0;
        do {
          xpath_lexer::next(this_00);
          uVar6 = this->_depth + 1;
          this->_depth = uVar6;
          if (0x400 < uVar6) {
            pxVar11 = this->_result;
            pcVar13 = "Exceeded maximum allowed query depth";
            goto LAB_0012f697;
          }
          pxVar7 = parse_expression(this,0);
          if (pxVar7 == (xpath_ast_node *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          pxVar8 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar8 == (xpath_ast_node *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          pxVar8->_type = '\x10';
          pxVar8->_rettype = '\x01';
          pxVar8->_axis = '\0';
          pxVar8->_test = '\0';
          pxVar8->_left = (xpath_ast_node *)0x0;
          pxVar8->_right = pxVar7;
          pxVar8->_next = (xpath_ast_node *)0x0;
          if ((this->_lexer)._cur_lexeme != lex_close_square_brace) {
            pxVar11 = this->_result;
            pcVar13 = "Expected \']\' to match an opening \'[\'";
            goto LAB_0012f697;
          }
          xpath_lexer::next(this_00);
          ppxVar9 = &pxVar16->_next;
          if (pxVar16 == (xpath_ast_node *)0x0) {
            ppxVar9 = &pxVar5->_right;
          }
          *ppxVar9 = pxVar8;
          pxVar16 = pxVar8;
        } while ((this->_lexer)._cur_lexeme == lex_open_square_brace);
      }
      this->_depth = sVar2;
      return pxVar5;
    }
    xpath_lexer::next(this_00);
    if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
      pxVar5 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar5 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar5->_type = '8';
      pxVar5->_rettype = '\x01';
      pxVar5->_axis = '\f';
      pxVar5->_test = '\x02';
      goto LAB_0012f2a8;
    }
  }
  pxVar11 = this->_result;
  pcVar13 = "Predicates are not allowed after an abbreviated step";
LAB_0012f697:
  pxVar11->error = pcVar13;
  pxVar11->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_step(xpath_ast_node* set)
		{
			if (set && set->rettype() != xpath_type_node_set)
				return error("Step has to be applied to node set");

			bool axis_specified = false;
			axis_t axis = axis_child; // implied child axis

			if (_lexer.current() == lex_axis_attribute)
			{
				axis = axis_attribute;
				axis_specified = true;

				_lexer.next();
			}
			else if (_lexer.current() == lex_dot)
			{
				_lexer.next();

				if (_lexer.current() == lex_open_square_brace)
					return error("Predicates are not allowed after an abbreviated step");

				return alloc_node(ast_step, set, axis_self, nodetest_type_node, NULL);
			}
			else if (_lexer.current() == lex_double_dot)
			{
				_lexer.next();

				if (_lexer.current() == lex_open_square_brace)
					return error("Predicates are not allowed after an abbreviated step");

				return alloc_node(ast_step, set, axis_parent, nodetest_type_node, NULL);
			}

			nodetest_t nt_type = nodetest_none;
			xpath_lexer_string nt_name;

			if (_lexer.current() == lex_string)
			{
				// node name test
				nt_name = _lexer.contents();
				_lexer.next();

				// was it an axis name?
				if (_lexer.current() == lex_double_colon)
				{
					// parse axis name
					if (axis_specified)
						return error("Two axis specifiers in one step");

					axis = parse_axis_name(nt_name, axis_specified);

					if (!axis_specified)
						return error("Unknown axis");

					// read actual node test
					_lexer.next();

					if (_lexer.current() == lex_multiply)
					{
						nt_type = nodetest_all;
						nt_name = xpath_lexer_string();
						_lexer.next();
					}
					else if (_lexer.current() == lex_string)
					{
						nt_name = _lexer.contents();
						_lexer.next();
					}
					else
					{
						return error("Unrecognized node test");
					}
				}

				if (nt_type == nodetest_none)
				{
					// node type test or processing-instruction
					if (_lexer.current() == lex_open_brace)
					{
						_lexer.next();

						if (_lexer.current() == lex_close_brace)
						{
							_lexer.next();

							nt_type = parse_node_test_type(nt_name);

							if (nt_type == nodetest_none)
								return error("Unrecognized node type");

							nt_name = xpath_lexer_string();
						}
						else if (nt_name == PUGIXML_TEXT("processing-instruction"))
						{
							if (_lexer.current() != lex_quoted_string)
								return error("Only literals are allowed as arguments to processing-instruction()");

							nt_type = nodetest_pi;
							nt_name = _lexer.contents();
							_lexer.next();

							if (_lexer.current() != lex_close_brace)
								return error("Unmatched brace near processing-instruction()");
							_lexer.next();
						}
						else
						{
							return error("Unmatched brace near node type test");
						}
					}
					// QName or NCName:*
					else
					{
						if (nt_name.end - nt_name.begin > 2 && nt_name.end[-2] == ':' && nt_name.end[-1] == '*') // NCName:*
						{
							nt_name.end--; // erase *

							nt_type = nodetest_all_in_namespace;
						}
						else
						{
							nt_type = nodetest_name;
						}
					}
				}
			}
			else if (_lexer.current() == lex_multiply)
			{
				nt_type = nodetest_all;
				_lexer.next();
			}
			else
			{
				return error("Unrecognized node test");
			}

			const char_t* nt_name_copy = alloc_string(nt_name);
			if (!nt_name_copy) return NULL;

			xpath_ast_node* n = alloc_node(ast_step, set, axis, nt_type, nt_name_copy);
			if (!n) return NULL;

			size_t old_depth = _depth;

			xpath_ast_node* last = NULL;

			while (_lexer.current() == lex_open_square_brace)
			{
				_lexer.next();

				if (++_depth > xpath_ast_depth_limit)
					return error_rec();

				xpath_ast_node* expr = parse_expression();
				if (!expr) return NULL;

				xpath_ast_node* pred = alloc_node(ast_predicate, NULL, expr, predicate_default);
				if (!pred) return NULL;

				if (_lexer.current() != lex_close_square_brace)
					return error("Expected ']' to match an opening '['");
				_lexer.next();

				if (last) last->set_next(pred);
				else n->set_right(pred);

				last = pred;
			}

			_depth = old_depth;

			return n;
		}